

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmGlobalUnixMakefileGenerator3::cmGlobalUnixMakefileGenerator3
          (cmGlobalUnixMakefileGenerator3 *this,cmake *cm)

{
  cmake *cm_local;
  cmGlobalUnixMakefileGenerator3 *this_local;
  
  cmGlobalGenerator::cmGlobalGenerator(&this->super_cmGlobalGenerator,cm);
  (this->super_cmGlobalGenerator)._vptr_cmGlobalGenerator =
       (_func_int **)&PTR__cmGlobalUnixMakefileGenerator3_00c1e5c8;
  std::__cxx11::string::string((string *)&this->IncludeDirective);
  std::__cxx11::string::string((string *)&this->EmptyRuleHackDepends);
  std::__cxx11::string::string((string *)&this->EmptyRuleHackCommand);
  std::
  map<const_cmTarget_*,_cmGlobalUnixMakefileGenerator3::TargetProgress,_cmStrictTargetComparison,_std::allocator<std::pair<const_cmTarget_*const,_cmGlobalUnixMakefileGenerator3::TargetProgress>_>_>
  ::map(&this->ProgressMap);
  (this->super_cmGlobalGenerator).ForceUnixPaths = true;
  std::__cxx11::string::operator=
            ((string *)&(this->super_cmGlobalGenerator).FindMakeProgramFile,
             "CMakeUnixFindMake.cmake");
  (this->super_cmGlobalGenerator).ToolSupportsColor = true;
  (this->super_cmGlobalGenerator).UseLinkScript = true;
  this->CommandDatabase = (cmGeneratedFileStream *)0x0;
  std::__cxx11::string::operator=((string *)&this->IncludeDirective,"include");
  this->DefineWindowsNULL = false;
  this->PassMakeflags = false;
  this->UnixCD = true;
  return;
}

Assistant:

cmGlobalUnixMakefileGenerator3::cmGlobalUnixMakefileGenerator3(cmake* cm)
  : cmGlobalGenerator(cm)
{
  // This type of makefile always requires unix style paths
  this->ForceUnixPaths = true;
  this->FindMakeProgramFile = "CMakeUnixFindMake.cmake";
  this->ToolSupportsColor = true;

#if defined(_WIN32) || defined(__VMS)
  this->UseLinkScript = false;
#else
  this->UseLinkScript = true;
#endif
  this->CommandDatabase = NULL;

  this->IncludeDirective = "include";
  this->DefineWindowsNULL = false;
  this->PassMakeflags = false;
  this->UnixCD = true;
}